

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Expression cnn::expr::colwise_add(Expression *x,Expression *bias)

{
  long in_RDX;
  undefined8 extraout_RDX;
  initializer_list<cnn::VariableIndex> *in_RSI;
  ComputationGraph *in_RDI;
  Expression EVar1;
  ComputationGraph *pg;
  ComputationGraph *this;
  VariableIndex local_38;
  VariableIndex VStack_34;
  VariableIndex *local_30;
  undefined8 local_28;
  long local_18;
  ComputationGraph *this_00;
  
  pg = (ComputationGraph *)in_RSI->_M_array;
  this = in_RDI;
  local_18 = in_RDX;
  this_00 = in_RDI;
  VariableIndex::VariableIndex(&local_38,(VariableIndex *)&in_RSI->_M_len);
  VariableIndex::VariableIndex(&VStack_34,(VariableIndex *)(local_18 + 8));
  local_30 = &local_38;
  local_28 = 2;
  ComputationGraph::add_function<cnn::AddVectorToAllColumns>(this_00,in_RSI);
  Expression::Expression((Expression *)this,pg,(VariableIndex *)in_RDI);
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = this;
  return EVar1;
}

Assistant:

Expression colwise_add(const Expression& x, const Expression& bias) { return Expression(x.pg, x.pg->add_function<AddVectorToAllColumns>({x.i, bias.i})); }